

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_ast_t * mpc_ast_traverse_next(mpc_ast_trav_t **trav)

{
  void *pvVar1;
  bool bVar2;
  undefined8 *puVar3;
  long *in_RDI;
  int cchild;
  mpc_ast_t *ret;
  mpc_ast_trav_t *to_free;
  mpc_ast_trav_t *n_trav;
  mpc_ast_t *local_28;
  mpc_ast_t *local_8;
  
  local_28 = (mpc_ast_t *)0x0;
  if (*in_RDI == 0) {
    local_8 = (mpc_ast_t *)0x0;
  }
  else {
    if (*(int *)(*in_RDI + 0x14) == 0) {
      local_28 = *(mpc_ast_t **)*in_RDI;
      while( true ) {
        bVar2 = false;
        if (*in_RDI != 0) {
          bVar2 = *(int *)(*(long *)*in_RDI + 0x30) <= *(int *)(*in_RDI + 0x10);
        }
        if (!bVar2) break;
        pvVar1 = (void *)*in_RDI;
        *in_RDI = *(long *)(*in_RDI + 8);
        free(pvVar1);
      }
      if (*in_RDI != 0) {
        puVar3 = (undefined8 *)malloc(0x18);
        *puVar3 = *(undefined8 *)
                   (*(long *)(*(long *)*in_RDI + 0x38) + (long)*(int *)(*in_RDI + 0x10) * 8);
        puVar3[1] = *in_RDI;
        *(undefined4 *)(puVar3 + 2) = 0;
        *(undefined4 *)((long)puVar3 + 0x14) = *(undefined4 *)(*in_RDI + 0x14);
        *(int *)(*in_RDI + 0x10) = *(int *)(*in_RDI + 0x10) + 1;
        *in_RDI = (long)puVar3;
      }
    }
    else if (*(int *)(*in_RDI + 0x14) == 1) {
      local_28 = *(mpc_ast_t **)*in_RDI;
      pvVar1 = (void *)*in_RDI;
      *in_RDI = *(long *)(*in_RDI + 8);
      free(pvVar1);
      if ((*in_RDI != 0) &&
         (*(int *)(*in_RDI + 0x10) = *(int *)(*in_RDI + 0x10) + 1,
         *(int *)(*in_RDI + 0x10) < *(int *)(*(long *)*in_RDI + 0x30))) {
        while (0 < *(int *)(*(long *)*in_RDI + 0x30)) {
          puVar3 = (undefined8 *)malloc(0x18);
          *puVar3 = *(undefined8 *)
                     (*(long *)(*(long *)*in_RDI + 0x38) + (long)*(int *)(*in_RDI + 0x10) * 8);
          puVar3[1] = *in_RDI;
          *(undefined4 *)(puVar3 + 2) = 0;
          *(undefined4 *)((long)puVar3 + 0x14) = *(undefined4 *)(*in_RDI + 0x14);
          *in_RDI = (long)puVar3;
        }
      }
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

mpc_ast_t *mpc_ast_traverse_next(mpc_ast_trav_t **trav) {
  mpc_ast_trav_t *n_trav, *to_free;
  mpc_ast_t *ret = NULL;
  int cchild;

  /* The end of traversal was reached */
  if(*trav == NULL) return NULL;

  switch((*trav)->order) {
    case mpc_ast_trav_order_pre:
      ret = (*trav)->curr_node;

      /* If there aren't any more children, go up */
      while(*trav != NULL &&
        (*trav)->curr_child >= (*trav)->curr_node->children_num)
      {
        to_free = *trav;
        *trav = (*trav)->parent;
        free(to_free);
      }

      /* If trav is NULL, the end was reached */
      if(*trav == NULL) {
        break;
      }

      /* Go to next child */
      n_trav = malloc(sizeof(mpc_ast_trav_t));

      cchild = (*trav)->curr_child;
      n_trav->curr_node = (*trav)->curr_node->children[cchild];
      n_trav->parent = *trav;
      n_trav->curr_child = 0;
      n_trav->order = (*trav)->order;

      (*trav)->curr_child++;
      *trav = n_trav;

      break;

    case mpc_ast_trav_order_post:
      ret = (*trav)->curr_node;

      /* Move up tree to the parent If the parent doesn't have any more nodes,
       * then this is the current node. If it does, move down to its left most
       * child. Also, free the previous traversal node */
      to_free = *trav;
      *trav = (*trav)->parent;
      free(to_free);

      if(*trav == NULL)
        break;

      /* Next child */
      (*trav)->curr_child++;

      /* If there aren't any more children, this is the next node */
      if((*trav)->curr_child >= (*trav)->curr_node->children_num) {
        break;
      }

      /* If there are still more children, find the leftmost child from this
       * node */
      while((*trav)->curr_node->children_num > 0) {
        n_trav = malloc(sizeof(mpc_ast_trav_t));

        cchild = (*trav)->curr_child;
        n_trav->curr_node = (*trav)->curr_node->children[cchild];
        n_trav->parent = *trav;
        n_trav->curr_child = 0;
        n_trav->order = (*trav)->order;

        *trav = n_trav;
      }

    default:
      /* Unreachable, but compiler complaints */
      break;
  }

  return ret;
}